

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  headers;
  string *local_10f8;
  string *local_1090;
  string *local_1028;
  string *local_fc0;
  string *local_f58;
  string *local_ef0;
  string *local_e88;
  string *local_e20;
  allocator local_dc1;
  string local_dc0 [39];
  allocator local_d99;
  string local_d98 [34];
  undefined1 local_d76;
  allocator local_d75;
  allocator local_d74;
  allocator local_d73;
  allocator local_d72;
  allocator local_d71;
  string *local_d70;
  string local_d68 [32];
  string local_d48 [32];
  string local_d28 [32];
  string local_d08 [32];
  string local_ce8 [32];
  iterator local_cc8;
  undefined8 local_cc0;
  undefined1 local_cb6;
  allocator local_cb5;
  allocator local_cb4;
  allocator local_cb3;
  allocator local_cb2;
  allocator local_cb1;
  string *local_cb0;
  string local_ca8 [32];
  string local_c88 [32];
  string local_c68 [32];
  string local_c48 [32];
  string local_c28 [32];
  iterator local_c08;
  undefined8 local_c00;
  undefined1 local_bf6;
  allocator local_bf5;
  allocator local_bf4;
  allocator local_bf3;
  allocator local_bf2;
  allocator local_bf1;
  string *local_bf0;
  string local_be8 [32];
  string local_bc8 [32];
  string local_ba8 [32];
  string local_b88 [32];
  string local_b68 [32];
  iterator local_b48;
  undefined8 local_b40;
  undefined1 local_b36;
  allocator local_b35;
  allocator local_b34;
  allocator local_b33;
  allocator local_b32;
  allocator local_b31;
  string *local_b30;
  string local_b28 [32];
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  iterator local_a88;
  undefined8 local_a80;
  undefined1 local_a76;
  allocator local_a75;
  allocator local_a74;
  allocator local_a73;
  allocator local_a72;
  allocator local_a71;
  string *local_a70;
  string local_a68 [32];
  string local_a48 [32];
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  iterator local_9c8;
  undefined8 local_9c0;
  undefined1 local_9b6;
  allocator local_9b5;
  allocator local_9b4;
  allocator local_9b3;
  allocator local_9b2;
  allocator local_9b1;
  string *local_9b0;
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  iterator local_908;
  undefined8 local_900;
  undefined1 local_8f6;
  allocator local_8f5;
  allocator local_8f4;
  allocator local_8f3;
  allocator local_8f2;
  allocator local_8f1;
  string *local_8f0;
  string local_8e8 [32];
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868 [32];
  iterator local_848;
  undefined8 local_840;
  undefined1 local_831;
  allocator local_830;
  allocator local_82f;
  allocator local_82e;
  allocator local_82d [20];
  allocator local_819;
  string *local_818;
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  iterator local_770;
  undefined8 local_768;
  undefined1 local_760 [8];
  ConsoleTable table;
  
  table._1868_4_ = 0;
  local_831 = 1;
  local_818 = local_810;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"Country",&local_819);
  local_818 = local_7f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f0,"Capital",local_82d);
  local_818 = local_7d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d0,"Population",&local_82e);
  local_818 = local_7b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"Area",&local_82f);
  local_818 = local_790;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_790,"Currency",&local_830);
  local_831 = 0;
  local_770 = (iterator)local_810;
  local_768 = 5;
  headers._M_len = 5;
  headers._M_array = local_770;
  ConsoleTable::ConsoleTable((ConsoleTable *)local_760,headers);
  local_e20 = (string *)&local_770;
  do {
    local_e20 = local_e20 + -0x20;
    std::__cxx11::string::~string(local_e20);
  } while (local_e20 != local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_82f);
  std::allocator<char>::~allocator((allocator<char> *)&local_82e);
  std::allocator<char>::~allocator((allocator<char> *)local_82d);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  ConsoleTable::setPadding((ConsoleTable *)local_760,2);
  ConsoleTable::setStyle((ConsoleTable *)local_760,0);
  local_8f6 = 1;
  local_8f0 = local_8e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"Germany",&local_8f1);
  local_8f0 = local_8c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c8,"Berlin",&local_8f2);
  local_8f0 = local_8a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a8,"82,800,000",&local_8f3);
  local_8f0 = local_888;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_888,"357,168 km2",&local_8f4);
  local_8f0 = local_868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"Euro",&local_8f5);
  local_8f6 = 0;
  local_848 = (iterator)local_8e8;
  local_840 = 5;
  row_05._M_len = 5;
  row_05._M_array = local_848;
  ConsoleTable::operator+=((ConsoleTable *)local_760,row_05);
  local_e88 = (string *)&local_848;
  do {
    local_e88 = local_e88 + -0x20;
    std::__cxx11::string::~string(local_e88);
  } while (local_e88 != local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f5);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f4);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f3);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f2);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  local_9b6 = 1;
  local_9b0 = local_9a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9a8,"France",&local_9b1);
  local_9b0 = local_988;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_988,"Paris",&local_9b2);
  local_9b0 = local_968;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_968,"67,201,000",&local_9b3);
  local_9b0 = local_948;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_948,"640,679 km2 ",&local_9b4);
  local_9b0 = local_928;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_928,"Euro",&local_9b5);
  local_9b6 = 0;
  local_908 = (iterator)local_9a8;
  local_900 = 5;
  row_04._M_len = 5;
  row_04._M_array = local_908;
  ConsoleTable::operator+=((ConsoleTable *)local_760,row_04);
  local_ef0 = (string *)&local_908;
  do {
    local_ef0 = local_ef0 + -0x20;
    std::__cxx11::string::~string(local_ef0);
  } while (local_ef0 != local_9a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b5);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b4);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b3);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b2);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
  local_a76 = 1;
  local_a70 = local_a68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a68,"South Korea",&local_a71);
  local_a70 = local_a48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a48,"Seoul",&local_a72);
  local_a70 = local_a28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a28,"51,446,201",&local_a73);
  local_a70 = local_a08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a08,"100,210 km2 ",&local_a74);
  local_a70 = local_9e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"South Korean Won",&local_a75);
  local_a76 = 0;
  local_9c8 = (iterator)local_a68;
  local_9c0 = 5;
  row_03._M_len = 5;
  row_03._M_array = local_9c8;
  ConsoleTable::operator+=((ConsoleTable *)local_760,row_03);
  local_f58 = (string *)&local_9c8;
  do {
    local_f58 = local_f58 + -0x20;
    std::__cxx11::string::~string(local_f58);
  } while (local_f58 != local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a75);
  std::allocator<char>::~allocator((allocator<char> *)&local_a74);
  std::allocator<char>::~allocator((allocator<char> *)&local_a73);
  std::allocator<char>::~allocator((allocator<char> *)&local_a72);
  std::allocator<char>::~allocator((allocator<char> *)&local_a71);
  local_b36 = 1;
  local_b30 = local_b28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"Australia",&local_b31);
  local_b30 = local_b08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b08,"Canberra",&local_b32);
  local_b30 = local_ae8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae8,"24,877,800",&local_b33);
  local_b30 = local_ac8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,"7,692,024 km2",&local_b34);
  local_b30 = local_aa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa8,"Australian Dollar",&local_b35);
  local_b36 = 0;
  local_a88 = (iterator)local_b28;
  local_a80 = 5;
  row_02._M_len = 5;
  row_02._M_array = local_a88;
  ConsoleTable::operator+=((ConsoleTable *)local_760,row_02);
  local_fc0 = (string *)&local_a88;
  do {
    local_fc0 = local_fc0 + -0x20;
    std::__cxx11::string::~string(local_fc0);
  } while (local_fc0 != local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b35);
  std::allocator<char>::~allocator((allocator<char> *)&local_b34);
  std::allocator<char>::~allocator((allocator<char> *)&local_b33);
  std::allocator<char>::~allocator((allocator<char> *)&local_b32);
  std::allocator<char>::~allocator((allocator<char> *)&local_b31);
  local_bf6 = 1;
  local_bf0 = local_be8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be8,"China",&local_bf1);
  local_bf0 = local_bc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc8,"Beijing",&local_bf2);
  local_bf0 = local_ba8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba8,"1,403,500,365",&local_bf3);
  local_bf0 = local_b88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b88,"9,596,961 km2",&local_bf4);
  local_bf0 = local_b68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b68,"Yuan",&local_bf5);
  local_bf6 = 0;
  local_b48 = (iterator)local_be8;
  local_b40 = 5;
  row_01._M_len = 5;
  row_01._M_array = local_b48;
  ConsoleTable::operator+=((ConsoleTable *)local_760,row_01);
  local_1028 = (string *)&local_b48;
  do {
    local_1028 = local_1028 + -0x20;
    std::__cxx11::string::~string(local_1028);
  } while (local_1028 != local_be8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf5);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf4);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf3);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf2);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  local_cb6 = 1;
  local_cb0 = local_ca8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca8,"Iceland",&local_cb1);
  local_cb0 = local_c88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c88,"Reykjavik",&local_cb2);
  local_cb0 = local_c68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c68,"348,580",&local_cb3);
  local_cb0 = local_c48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c48,"102,775 km2",&local_cb4);
  local_cb0 = local_c28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c28,"Icelandic Krona",&local_cb5);
  local_cb6 = 0;
  local_c08 = (iterator)local_ca8;
  local_c00 = 5;
  row_00._M_len = 5;
  row_00._M_array = local_c08;
  ConsoleTable::operator+=((ConsoleTable *)local_760,row_00);
  local_1090 = (string *)&local_c08;
  do {
    local_1090 = local_1090 + -0x20;
    std::__cxx11::string::~string(local_1090);
  } while (local_1090 != local_ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb5);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb4);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb3);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb2);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
  local_d76 = 1;
  local_d70 = local_d68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d68,"Netherlands",&local_d71);
  local_d70 = local_d48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d48,"Amsterdam",&local_d72);
  local_d70 = local_d28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d28,"17,200,671",&local_d73);
  local_d70 = local_d08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d08,"41,543 km2",&local_d74);
  local_d70 = local_ce8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce8,"Euro",&local_d75);
  local_d76 = 0;
  local_cc8 = (iterator)local_d68;
  local_cc0 = 5;
  row._M_len = 5;
  row._M_array = local_cc8;
  ConsoleTable::operator+=((ConsoleTable *)local_760,row);
  local_10f8 = (string *)&local_cc8;
  do {
    local_10f8 = local_10f8 + -0x20;
    std::__cxx11::string::~string(local_10f8);
  } while (local_10f8 != local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d75);
  std::allocator<char>::~allocator((allocator<char> *)&local_d74);
  std::allocator<char>::~allocator((allocator<char> *)&local_d73);
  std::allocator<char>::~allocator((allocator<char> *)&local_d72);
  std::allocator<char>::~allocator((allocator<char> *)&local_d71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d98,"NEW ENTRY",&local_d99);
  ConsoleTable::updateRow((ConsoleTable *)local_760,3,1,(string *)local_d98);
  std::__cxx11::string::~string(local_d98);
  std::allocator<char>::~allocator((allocator<char> *)&local_d99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc0,"NEW HEADER",&local_dc1);
  ConsoleTable::updateHeader((ConsoleTable *)local_760,2,(string *)local_dc0);
  std::__cxx11::string::~string(local_dc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
  ConsoleTable::operator-=((ConsoleTable *)local_760,2);
  ConsoleTable::operator-=((ConsoleTable *)local_760,1);
  ConsoleTable::operator-=((ConsoleTable *)local_760,0);
  ConsoleTable::sort((ConsoleTable *)local_760,true);
  operator<<((ostream *)&std::cout,(ConsoleTable *)local_760);
  table._1868_4_ = 0;
  ConsoleTable::~ConsoleTable((ConsoleTable *)local_760);
  return table._1868_4_;
}

Assistant:

int main() {

    ConsoleTable table{"Country", "Capital", "Population", "Area", "Currency"};

    table.setPadding(2);
    table.setStyle(0);

    table += {"Germany", "Berlin", "82,800,000", "357,168 km2", "Euro"};
    table += {"France", "Paris", "67,201,000", "640,679 km2 ", "Euro"};
    table += {"South Korea", "Seoul", "51,446,201", "100,210 km2 ", "South Korean Won"};
    table += {"Australia", "Canberra", "24,877,800", "7,692,024 km2", "Australian Dollar"};
    table += {"China", "Beijing", "1,403,500,365", "9,596,961 km2", "Yuan"};
    table += {"Iceland", "Reykjavik", "348,580", "102,775 km2", "Icelandic Krona"};
    table += {"Netherlands", "Amsterdam", "17,200,671", "41,543 km2", "Euro"};

    table.updateRow(3, 1, "NEW ENTRY");
    table.updateHeader(2, "NEW HEADER");

    table -= 2;
    table -= 1;
    table -= 0;
    table.sort(true);

    std::cout << table;

    return 0;
}